

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

int __thiscall deqp::gles31::Functional::UniformCase::init(UniformCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  UniformCollection *this_00;
  NotSupportedError *pNVar3;
  int local_250;
  int local_24c;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_191;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_e9;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  int local_30;
  int combinedTexUnitsSupported;
  int fragmentTexUnitsSupported;
  int vertexTexUnitsSupported;
  int combinedTexUnitsRequired;
  int fragmentTexUnitsRequired;
  int vertexTexUnitsRequired;
  int numSamplerUniforms;
  Functions *funcs;
  UniformCase *this_local;
  
  funcs = (Functions *)this;
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _vertexTexUnitsRequired = (Functions *)CONCAT44(extraout_var,iVar1);
  this_00 = de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
            ::operator->(&this->m_uniformCollection);
  fragmentTexUnitsRequired = anon_unknown_1::UniformCollection::getNumSamplers(this_00);
  local_24c = fragmentTexUnitsRequired;
  if (this->m_caseShaderType == CASESHADERTYPE_FRAGMENT) {
    local_24c = 0;
  }
  combinedTexUnitsRequired = local_24c;
  local_250 = fragmentTexUnitsRequired;
  if (this->m_caseShaderType == CASESHADERTYPE_VERTEX) {
    local_250 = 0;
  }
  vertexTexUnitsSupported = local_250;
  fragmentTexUnitsSupported = local_24c + local_250;
  combinedTexUnitsSupported = getGLInt(_vertexTexUnitsRequired,0x8b4c);
  local_30 = getGLInt(_vertexTexUnitsRequired,0x8872);
  local_34 = getGLInt(_vertexTexUnitsRequired,0x8b4d);
  if (combinedTexUnitsSupported < combinedTexUnitsRequired) {
    local_e9 = 1;
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_b8,&combinedTexUnitsRequired);
    std::operator+(&local_98,&local_b8," vertex texture units required, ");
    de::toString<int>(&local_e8,&combinedTexUnitsSupported);
    std::operator+(&local_78,&local_98,&local_e8);
    std::operator+(&local_58,&local_78," supported");
    tcu::NotSupportedError::NotSupportedError(pNVar3,&local_58);
    local_e9 = 0;
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (local_30 < vertexTexUnitsSupported) {
    local_191 = 1;
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_170,&vertexTexUnitsSupported);
    std::operator+(&local_150,&local_170," fragment texture units required, ");
    de::toString<int>(&local_190,&local_30);
    std::operator+(&local_130,&local_150,&local_190);
    std::operator+(&local_110,&local_130," supported");
    tcu::NotSupportedError::NotSupportedError(pNVar3,&local_110);
    local_191 = 0;
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (fragmentTexUnitsSupported <= local_34) {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    return extraout_EAX;
  }
  pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_218,&fragmentTexUnitsSupported);
  std::operator+(&local_1f8,&local_218," combined texture units required, ");
  de::toString<int>(&local_238,&local_34);
  std::operator+(&local_1d8,&local_1f8,&local_238);
  std::operator+(&local_1b8,&local_1d8," supported");
  tcu::NotSupportedError::NotSupportedError(pNVar3,&local_1b8);
  __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void UniformCase::init (void)
{
	{
		const glw::Functions&	funcs						= m_context.getRenderContext().getFunctions();
		const int				numSamplerUniforms			= m_uniformCollection->getNumSamplers();
		const int				vertexTexUnitsRequired		= m_caseShaderType != CASESHADERTYPE_FRAGMENT ? numSamplerUniforms : 0;
		const int				fragmentTexUnitsRequired	= m_caseShaderType != CASESHADERTYPE_VERTEX ? numSamplerUniforms : 0;
		const int				combinedTexUnitsRequired	= vertexTexUnitsRequired + fragmentTexUnitsRequired;
		const int				vertexTexUnitsSupported		= getGLInt(funcs, GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS);
		const int				fragmentTexUnitsSupported	= getGLInt(funcs, GL_MAX_TEXTURE_IMAGE_UNITS);
		const int				combinedTexUnitsSupported	= getGLInt(funcs, GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS);

		DE_ASSERT(numSamplerUniforms <= MAX_NUM_SAMPLER_UNIFORMS);

		if (vertexTexUnitsRequired > vertexTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(vertexTexUnitsRequired) + " vertex texture units required, " + de::toString(vertexTexUnitsSupported) + " supported");
		if (fragmentTexUnitsRequired > fragmentTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(fragmentTexUnitsRequired) + " fragment texture units required, " + de::toString(fragmentTexUnitsSupported) + " supported");
		if (combinedTexUnitsRequired > combinedTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(combinedTexUnitsRequired) + " combined texture units required, " + de::toString(combinedTexUnitsSupported) + " supported");
	}

	enableLogging(true);
}